

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::ReturnValueVerifier::operator()
          (ReturnValueVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  AtomicOperation AVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  CubeFace face;
  deUint32 value;
  TextureFormat *pTVar5;
  char *__s;
  int *piVar6;
  float *pfVar7;
  MessageBuilder *pMVar8;
  TestLog *pTVar9;
  Vector<int,_2> (*arr) [5];
  float (*arr_00) [5];
  Vector<int,_3> (*arr_01) [5];
  float (*arr_02) [5];
  bool local_811;
  int *local_7e0;
  Vector<int,_3> *local_7c8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  MessageBuilder local_708;
  MessageBuilder local_588;
  MessageBuilder local_408;
  bool local_281;
  undefined1 local_280 [7];
  bool success;
  undefined1 local_270 [16];
  undefined1 local_260 [8];
  IVec3 gid;
  IVec2 pixCoord;
  int i;
  IVec2 pixelCoords [5];
  undefined1 local_218 [8];
  IVec3 invocationGlobalIDs [5];
  Functional local_1d4 [8];
  IntFloatArr atomicArgs;
  IntFloatArr returnValues;
  int x;
  int y;
  byte local_17b;
  byte local_17a;
  allocator<char> local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  LogImage local_c8;
  Vector<int,_2> local_38;
  IVec2 dispatchSizeXY;
  bool isIntegerFormat;
  int sliceOrFaceNdx_local;
  ConstPixelBufferAccess *resultSlice_local;
  TestLog *log_local;
  ReturnValueVerifier *this_local;
  
  dispatchSizeXY.m_data[1] = sliceOrFaceNdx;
  pTVar5 = tcu::ConstPixelBufferAccess::getFormat(resultSlice);
  dispatchSizeXY.m_data[0]._3_1_ = isFormatTypeInteger(pTVar5->type);
  iVar3 = tcu::ConstPixelBufferAccess::getWidth(resultSlice);
  iVar4 = tcu::ConstPixelBufferAccess::getHeight(resultSlice);
  tcu::Vector<int,_2>::Vector(&local_38,iVar3,iVar4);
  de::toString<int>(&local_108,dispatchSizeXY.m_data + 1);
  std::operator+(&local_e8,"ReturnValues",&local_108);
  local_17a = 0;
  local_17b = 0;
  x._3_1_ = 0;
  if (this->m_imageType == TEXTURETYPE_CUBE) {
    face = glslImageFuncZToCubeFace(dispatchSizeXY.m_data[1]);
    value = cubeFaceToGLFace(face);
    __s = glu::getCubeMapFaceName(value);
    std::allocator<char>::allocator();
    local_17a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,__s,&local_179);
    local_17b = 1;
    std::operator+(&local_158,"face ",&local_178);
  }
  else {
    de::toString<int>((string *)&y,dispatchSizeXY.m_data + 1);
    x._3_1_ = 1;
    std::operator+(&local_158,"slice ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y);
  }
  std::operator+(&local_138,"Per-Invocation Return Values, ",&local_158);
  tcu::LogImage::LogImage(&local_c8,&local_e8,&local_138,resultSlice,QP_IMAGE_COMPRESSION_MODE_BEST)
  ;
  tcu::TestLog::operator<<(log,&local_c8);
  tcu::LogImage::~LogImage(&local_c8);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  if ((x._3_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&y);
  }
  if ((local_17b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_178);
  }
  if ((local_17a & 1) != 0) {
    std::allocator<char>::~allocator(&local_179);
  }
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  returnValues.i[4] = 0;
  do {
    uVar2 = returnValues.i[4];
    iVar3 = tcu::Vector<int,_2>::y(&this->m_endResultImageLayerSize);
    if (iVar3 <= (int)uVar2) {
      return true;
    }
    for (returnValues.i[3] = 0; uVar2 = returnValues.i[3],
        iVar3 = tcu::Vector<int,_2>::x(&this->m_endResultImageLayerSize), (int)uVar2 < iVar3;
        returnValues.i[3] = returnValues.i[3] + 1) {
      local_7c8 = (Vector<int,_3> *)local_218;
      do {
        tcu::Vector<int,_3>::Vector(local_7c8);
        local_7c8 = local_7c8 + 1;
      } while (local_7c8 != (Vector<int,_3> *)(invocationGlobalIDs[4].m_data + 1));
      local_7e0 = pixCoord.m_data + 1;
      do {
        tcu::Vector<int,_2>::Vector((Vector<int,_2> *)local_7e0);
        local_7e0 = local_7e0 + 2;
      } while ((IVec2 *)local_7e0 != pixelCoords + 4);
      for (pixCoord.m_data[0] = 0; uVar2 = returnValues.i[3], iVar3 = pixCoord.m_data[0],
          pixCoord.m_data[0] < 5; pixCoord.m_data[0] = pixCoord.m_data[0] + 1) {
        iVar4 = tcu::Vector<int,_2>::x(&this->m_endResultImageLayerSize);
        tcu::Vector<int,_2>::Vector
                  ((Vector<int,_2> *)(gid.m_data + 1),uVar2 + iVar3 * iVar4,returnValues.i[4]);
        iVar3 = tcu::Vector<int,_2>::x((Vector<int,_2> *)(gid.m_data + 1));
        iVar4 = tcu::Vector<int,_2>::y((Vector<int,_2> *)(gid.m_data + 1));
        tcu::Vector<int,_3>::Vector
                  ((Vector<int,_3> *)local_260,iVar3,iVar4,dispatchSizeXY.m_data[1]);
        *(undefined1 (*) [8])(invocationGlobalIDs[(long)pixCoord.m_data[0] + -1].m_data + 1) =
             local_260;
        invocationGlobalIDs[pixCoord.m_data[0]].m_data[0] = gid.m_data[0];
        *(undefined8 *)((&pixCoord)[pixCoord.m_data[0]].m_data + 1) = gid.m_data._4_8_;
        if ((dispatchSizeXY.m_data[0]._3_1_ & 1) == 0) {
          iVar3 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_260);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_280,(int)resultSlice,iVar3,returnValues.i[4]);
          pfVar7 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_280);
          *(float *)((long)&atomicArgs + (long)pixCoord.m_data[0] * 4 + 0xc) = *pfVar7;
          iVar3 = getAtomicFuncArgument(this->m_operation,(IVec3 *)local_260,&local_38);
          *(float *)(local_1d4 + (long)pixCoord.m_data[0] * 4) = (float)iVar3;
        }
        else {
          iVar3 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_260);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_270,(int)resultSlice,iVar3,returnValues.i[4]);
          piVar6 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_270);
          *(int *)((long)&atomicArgs + (long)pixCoord.m_data[0] * 4 + 0xc) = *piVar6;
          iVar3 = getAtomicFuncArgument(this->m_operation,(IVec3 *)local_260,&local_38);
          *(int *)(local_1d4 + (long)pixCoord.m_data[0] * 4) = iVar3;
        }
      }
      if ((dispatchSizeXY.m_data[0]._3_1_ & 1) == 0) {
        AVar1 = this->m_operation;
        iVar3 = getOperationInitialValue(this->m_operation);
        local_811 = verifyOperationAccumulationIntermediateValues<float>
                              (AVar1,(float)iVar3,(float (*) [5])local_1d4,
                               (float (*) [5])(atomicArgs.i + 3));
      }
      else {
        AVar1 = this->m_operation;
        iVar3 = getOperationInitialValue(this->m_operation);
        local_811 = verifyOperationAccumulationIntermediateValues<int>
                              (AVar1,iVar3,(int (*) [5])local_1d4,(int (*) [5])(atomicArgs.i + 3));
      }
      local_281 = local_811;
      if (local_811 == false) {
        tcu::TestLog::operator<<(&local_708,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_708,
                            (char (*) [50])"// Failure: intermediate return values at pixels ");
        arrayStr<tcu::Vector<int,2>,5>(&local_728,(Functional *)(pixCoord.m_data + 1),arr);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_728);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [23])" of current layer are ");
        if ((dispatchSizeXY.m_data[0]._3_1_ & 1) == 0) {
          arrayStr<float,5>(&local_748,(Functional *)(atomicArgs.i + 3),arr_00);
        }
        else {
          arrayStr<int,5>(&local_748,(Functional *)(atomicArgs.i + 3),(int (*) [5])arr_00);
        }
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_748);
        pTVar9 = tcu::MessageBuilder::operator<<
                           (pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::TestLog::operator<<(&local_588,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_588,
                            (char (*) [52])"// Note: relevant shader invocation global IDs are ");
        arrayStr<tcu::Vector<int,3>,5>(&local_768,(Functional *)local_218,arr_01);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_768);
        pTVar9 = tcu::MessageBuilder::operator<<
                           (pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::TestLog::operator<<(&local_408,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_408,
                            (char (*) [49])"// Note: data expression values for the IDs are ");
        if ((dispatchSizeXY.m_data[0]._3_1_ & 1) == 0) {
          arrayStr<float,5>(&local_788,local_1d4,arr_02);
        }
        else {
          arrayStr<int,5>(&local_788,local_1d4,(int (*) [5])arr_02);
        }
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_788);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(char (*) [67])
                                   "; return values are not a valid result for any order of operations"
                           );
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_788);
        tcu::MessageBuilder::~MessageBuilder(&local_408);
        std::__cxx11::string::~string((string *)&local_768);
        tcu::MessageBuilder::~MessageBuilder(&local_588);
        std::__cxx11::string::~string((string *)&local_748);
        std::__cxx11::string::~string((string *)&local_728);
        tcu::MessageBuilder::~MessageBuilder(&local_708);
        return false;
      }
    }
    returnValues.i[4] = returnValues.i[4] + 1;
  } while( true );
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		const bool		isIntegerFormat		(isFormatTypeInteger(resultSlice.getFormat().type));
		const IVec2		dispatchSizeXY	(resultSlice.getWidth(), resultSlice.getHeight());

		DE_ASSERT(resultSlice.getWidth()	== NUM_INVOCATIONS_PER_PIXEL*m_endResultImageLayerSize.x()	&&
				  resultSlice.getHeight()	== m_endResultImageLayerSize.y()							&&
				  resultSlice.getDepth()	== 1);

		log << TestLog::Image("ReturnValues" + toString(sliceOrFaceNdx),
							  "Per-Invocation Return Values, "
								   + (m_imageType == TEXTURETYPE_CUBE ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
																	  : "slice " + toString(sliceOrFaceNdx)),
							  resultSlice);

		for (int y = 0; y < m_endResultImageLayerSize.y(); y++)
		for (int x = 0; x < m_endResultImageLayerSize.x(); x++)
		{
			union IntFloatArr
			{
				int		i[NUM_INVOCATIONS_PER_PIXEL];
				float	f[NUM_INVOCATIONS_PER_PIXEL];
			};

			// Get the atomic function args and return values for all the invocations that contribute to the pixel (x, y) in the current end result slice.

			IntFloatArr		returnValues;
			IntFloatArr		atomicArgs;
			IVec3			invocationGlobalIDs[NUM_INVOCATIONS_PER_PIXEL];
			IVec2			pixelCoords[NUM_INVOCATIONS_PER_PIXEL];

			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				const IVec2 pixCoord	(x + i*m_endResultImageLayerSize.x(), y);
				const IVec3 gid			(pixCoord.x(), pixCoord.y(), sliceOrFaceNdx);

				invocationGlobalIDs[i]	= gid;
				pixelCoords[i]			= pixCoord;

				if (isIntegerFormat)
				{
					returnValues.i[i]	= resultSlice.getPixelInt(gid.x(), y).x();
					atomicArgs.i[i]		= getAtomicFuncArgument(m_operation, gid, dispatchSizeXY);
				}
				else
				{
					returnValues.f[i]	= resultSlice.getPixel(gid.x(), y).x();
					atomicArgs.f[i]		= (float)getAtomicFuncArgument(m_operation, gid, dispatchSizeXY);
				}
			}

			// Verify that the return values form a valid sequence.

			{
				const bool success = isIntegerFormat ? verifyOperationAccumulationIntermediateValues(m_operation,
																									 getOperationInitialValue(m_operation),
																									 atomicArgs.i,
																									 returnValues.i)

													 : verifyOperationAccumulationIntermediateValues(m_operation,
																									 (float)getOperationInitialValue(m_operation),
																									 atomicArgs.f,
																									 returnValues.f);

				if (!success)
				{
					log << TestLog::Message << "// Failure: intermediate return values at pixels " << arrayStr(pixelCoords) << " of current layer are "
											<< (isIntegerFormat ? arrayStr(returnValues.i) : arrayStr(returnValues.f)) << TestLog::EndMessage
						<< TestLog::Message << "// Note: relevant shader invocation global IDs are " << arrayStr(invocationGlobalIDs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: data expression values for the IDs are "
											<< (isIntegerFormat ? arrayStr(atomicArgs.i) : arrayStr(atomicArgs.f))
											<< "; return values are not a valid result for any order of operations" << TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}